

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test::TestBody
          (ExtendedDataDictionaryTest_TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  FieldDef endSize;
  ExtendableDataDictionary extendable_data_dictionary1;
  AssertHelper local_190;
  internal local_188 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  AssertHelper local_178;
  undefined1 local_170 [24];
  undefined8 local_158 [3];
  bool local_140;
  FieldDef local_138 [8];
  long *local_130;
  long local_128;
  long local_120 [3];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  FieldDef local_a8 [8];
  long *local_a0;
  long local_90 [3];
  code *local_78;
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  local_40;
  
  CreateExtendableDataDictionary();
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"EndSize","");
  pcVar2 = (char *)0x1;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_138,5000,0x4c,local_c8,0x31);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)local_170);
  local_188[0] = (internal)(local_140 ^ 1);
  local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_140 == true) {
    local_140 = false;
    if ((undefined8 *)local_170._8_8_ != local_158) {
      operator_delete((void *)local_170._8_8_,local_158[0] + 1);
    }
  }
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,local_188,
               (AssertionResult *)"extendable_data_dictionary1.FieldDefByFid(endSize.fid_)","true",
               "false",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x71,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
      operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_130,local_128 + (long)local_130);
    bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
              (local_170,&local_78,local_e8);
    local_188[0] = (internal)(local_140 ^ 1);
    local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_140 == true) {
      local_140 = false;
      if ((undefined8 *)local_170._8_8_ != local_158) {
        operator_delete((void *)local_170._8_8_,local_158[0] + 1);
      }
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_188[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,local_188,
                 (AssertionResult *)"extendable_data_dictionary1.FieldDefByName(endSize.name_)",
                 "true","false",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                 ,0x72,(char *)local_170._0_8_);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      if (local_190.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_190.data_ + 8))();
        }
        local_190.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a8,local_138);
      bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(&local_78,local_a8);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid((int)local_170);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                (local_188,"endSize","extendable_data_dictionary1.FieldDefByFid(endSize.fid_)",
                 local_138,(optional<bidfx_public_api::price::pixie::FieldDef> *)local_170);
      if (local_140 == true) {
        local_140 = false;
        if ((undefined8 *)local_170._8_8_ != local_158) {
          operator_delete((void *)local_170._8_8_,local_158[0] + 1);
        }
      }
      if (local_188[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_170);
        if (local_180.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_180.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                   ,0x74,pcVar2);
        testing::internal::AssertHelper::operator=(&local_190,(Message *)local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        if ((long *)local_170._0_8_ != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_170._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_170._0_8_ + 8))();
          }
          local_170._0_8_ = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_108[0] = local_f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_108,local_130,local_128 + (long)local_130);
        bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
                  (local_170,&local_78,local_108);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
                  (local_188,"endSize","extendable_data_dictionary1.FieldDefByName(endSize.name_)",
                   local_138,(optional<bidfx_public_api::price::pixie::FieldDef> *)local_170);
        if (local_140 == true) {
          local_140 = false;
          if ((undefined8 *)local_170._8_8_ != local_158) {
            operator_delete((void *)local_170._8_8_,local_158[0] + 1);
          }
        }
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0],local_f8[0] + 1);
        }
        if (local_188[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_170);
          if (local_180.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_180.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0x75,pcVar2);
          testing::internal::AssertHelper::operator=(&local_190,(Message *)local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          if ((long *)local_170._0_8_ != (long *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && ((long *)local_170._0_8_ != (long *)0x0)) {
              (**(code **)(*(long *)local_170._0_8_ + 8))();
            }
            local_170._0_8_ = (long *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  local_78 = bidfx_public_api::tools::ByteBuffer::WriteShort;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&local_40);
  std::
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNewFieldsDefsCanBeAddedToTheEndOfTheDictionary)
{
    ExtendableDataDictionary extendable_data_dictionary1 = CreateExtendableDataDictionary();
    FieldDef endSize(5000, FieldTypeEnum::LONG, "EndSize", FieldEncodingEnum::FIXED1, 1);
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_FALSE(extendable_data_dictionary1.FieldDefByName(endSize.name_));
    extendable_data_dictionary1.AddFieldDef(endSize);
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByFid(endSize.fid_));
    ASSERT_EQ(endSize, extendable_data_dictionary1.FieldDefByName(endSize.name_));
}